

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Namco_Apu.cpp
# Opt level: O2

void __thiscall Nes_Namco_Apu::run_until(Nes_Namco_Apu *this,blip_time_t nes_end_time)

{
  byte bVar1;
  byte bVar2;
  blip_ulong bVar3;
  Blip_Buffer *blip_buf;
  int iVar4;
  int iVar5;
  int iVar6;
  Namco_Osc *pNVar7;
  blip_resampled_time_t time;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  
  uVar10 = this->reg[0x7f] >> 4 & 7;
  iVar4 = uVar10 + 1;
  uVar11 = (ulong)uVar10 ^ 7;
  do {
    if (uVar11 == 8) {
      this->last_time = nes_end_time;
      return;
    }
    blip_buf = this->oscs[uVar11].output;
    if (blip_buf != (Blip_Buffer *)0x0) {
      pNVar7 = this->oscs + uVar11;
      blip_buf->modified_ = 1;
      bVar3 = blip_buf->factor_;
      time = this->last_time * bVar3 + blip_buf->offset_ + pNVar7->delay;
      uVar10 = bVar3 * nes_end_time + blip_buf->offset_;
      pNVar7->delay = 0;
      if (time < uVar10) {
        bVar1 = (byte)(this->synth).impulses[uVar11 * 4 + -0x32];
        if (0x1f < bVar1) {
          bVar2 = *(byte *)((long)(this->synth).impulses + uVar11 * 8 + -0x61);
          if ((bVar2 & 0xf) != 0) {
            uVar9 = (uint)this->reg[uVar11 * 8 + 0x40] |
                    (uint)(byte)(this->synth).impulses[uVar11 * 4 + -0x33] << 8 |
                    (bVar1 & 3) << 0x10;
            if ((uint)(iVar4 * 0x40) <= uVar9) {
              iVar8 = (int)pNVar7->last_amp;
              iVar6 = (int)pNVar7->wave_pos;
              do {
                iVar5 = (uint)(byte)(this->synth).impulses[uVar11 * 4 + -0x31] + iVar6;
                iVar12 = (this->reg[iVar5 >> 1] >> ((char)iVar5 * '\x04' & 4U) & 0xf) *
                         (bVar2 & 0xf);
                iVar5 = iVar12 - iVar8;
                if (iVar5 != 0) {
                  Blip_Synth<12,_15>::offset_resampled(&this->synth,time,iVar5,blip_buf);
                  iVar8 = iVar12;
                }
                iVar6 = iVar6 + 1;
                time = time + ((bVar3 * 0xf0000) / uVar9) * iVar4;
                if ((int)(uint)(byte)(0x20 - (bVar1 & 0x1c)) <= iVar6) {
                  iVar6 = 0;
                }
              } while (time < uVar10);
              pNVar7->wave_pos = (short)iVar6;
              pNVar7->last_amp = (short)iVar8;
              goto LAB_0062fc09;
            }
          }
        }
      }
      else {
LAB_0062fc09:
        pNVar7->delay = time - uVar10;
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void Nes_Namco_Apu::run_until( blip_time_t nes_end_time )
{
	int active_oscs = (reg [0x7F] >> 4 & 7) + 1;
	for ( int i = osc_count - active_oscs; i < osc_count; i++ )
	{
		Namco_Osc& osc = oscs [i];
		Blip_Buffer* output = osc.output;
		if ( !output )
			continue;
		output->set_modified();
		
		blip_resampled_time_t time =
				output->resampled_time( last_time ) + osc.delay;
		blip_resampled_time_t end_time = output->resampled_time( nes_end_time );
		osc.delay = 0;
		if ( time < end_time )
		{
			const BOOST::uint8_t* osc_reg = &reg [i * 8 + 0x40];
			if ( !(osc_reg [4] & 0xE0) )
				continue;
			
			int volume = osc_reg [7] & 15;
			if ( !volume )
				continue;
			
			blargg_long freq = (osc_reg [4] & 3) * 0x10000 + osc_reg [2] * 0x100L + osc_reg [0];
			if ( freq < 64 * active_oscs )
				continue; // prevent low frequencies from excessively delaying freq changes
			blip_resampled_time_t period =
					output->resampled_duration( 983040 ) / freq * active_oscs;
			
			int wave_size = 32 - (osc_reg [4] >> 2 & 7) * 4;
			if ( !wave_size )
				continue;
			
			int last_amp = osc.last_amp;
			int wave_pos = osc.wave_pos;
			
			do
			{
				// read wave sample
				int addr = wave_pos + osc_reg [6];
				int sample = reg [addr >> 1] >> (addr << 2 & 4);
				wave_pos++;
				sample = (sample & 15) * volume;
				
				// output impulse if amplitude changed
				int delta = sample - last_amp;
				if ( delta )
				{
					last_amp = sample;
					synth.offset_resampled( time, delta, output );
				}
				
				// next sample
				time += period;
				if ( wave_pos >= wave_size )
					wave_pos = 0;
			}
			while ( time < end_time );
			
			osc.wave_pos = wave_pos;
			osc.last_amp = last_amp;
		}
		osc.delay = time - end_time;
	}
	
	last_time = nes_end_time;
}